

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::getFog
          (CNullDriver *this,SColor *color,E_FOG_TYPE *fogType,f32 *start,f32 *end,f32 *density,
          bool *pixelFog,bool *rangeFog)

{
  f32 *density_local;
  f32 *end_local;
  f32 *start_local;
  E_FOG_TYPE *fogType_local;
  SColor *color_local;
  CNullDriver *this_local;
  
  color->color = (this->FogColor).color;
  *fogType = this->FogType;
  *start = this->FogStart;
  *end = this->FogEnd;
  *density = this->FogDensity;
  *pixelFog = (bool)(this->PixelFog & 1);
  *rangeFog = (bool)(this->RangeFog & 1);
  return;
}

Assistant:

void CNullDriver::getFog(SColor &color, E_FOG_TYPE &fogType, f32 &start, f32 &end,
		f32 &density, bool &pixelFog, bool &rangeFog)
{
	color = FogColor;
	fogType = FogType;
	start = FogStart;
	end = FogEnd;
	density = FogDensity;
	pixelFog = PixelFog;
	rangeFog = RangeFog;
}